

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

_Bool lore_save(char *name)

{
  errr eVar1;
  char path [1024];
  char acStack_408 [1024];
  
  path_build(acStack_408,0x400,ANGBAND_DIR_USER,name);
  eVar1 = text_lines_to_file(acStack_408,write_lore_entries);
  if (eVar1 != 0) {
    msg("Failed to create file %s.new",acStack_408);
  }
  return eVar1 == 0;
}

Assistant:

bool lore_save(const char *name)
{
	char path[1024];

	/* Write to the user directory */
	path_build(path, sizeof(path), ANGBAND_DIR_USER, name);

	if (text_lines_to_file(path, write_lore_entries)) {
		msg("Failed to create file %s.new", path);
		return false;
	}

	return true;
}